

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O0

anon_class_40_5_d6c92a71 *
qclab::qgates::lambda_QGate1<double>
          (anon_class_40_5_d6c92a71 *__return_storage_ptr__,Op op,SquareMatrix<double> *mat1,
          double *vector)

{
  double dVar1;
  double dVar2;
  int64_t iVar3;
  double *pdVar4;
  double *pdVar5;
  double *local_68;
  anon_class_40_5_d6c92a71 f;
  double m22;
  double m21;
  double m12;
  double m11;
  double *vector_local;
  SquareMatrix<double> *mat1_local;
  Op op_local;
  
  iVar3 = dense::SquareMatrix<double>::size(mat1);
  if (iVar3 == 2) {
    dense::operateInPlace<qclab::dense::SquareMatrix<double>>(op,mat1);
    pdVar4 = dense::SquareMatrix<double>::operator()(mat1,0,0);
    pdVar4 = (double *)*pdVar4;
    pdVar5 = dense::SquareMatrix<double>::operator()(mat1,0,1);
    dVar1 = *pdVar5;
    pdVar5 = dense::SquareMatrix<double>::operator()(mat1,1,0);
    dVar2 = *pdVar5;
    pdVar5 = dense::SquareMatrix<double>::operator()(mat1,1,1);
    f.m21 = *pdVar5;
    local_68 = vector;
    f.vector = pdVar4;
    f.m11 = dVar1;
    f.m12 = dVar2;
    f.m22 = f.m21;
    memcpy(__return_storage_ptr__,&local_68,0x28);
    return __return_storage_ptr__;
  }
  __assert_fail("mat1.size() == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/apply.hpp"
                ,0xd,
                "auto qclab::qgates::lambda_QGate1(Op, qclab::dense::SquareMatrix<T>, T *) [T = double]"
               );
}

Assistant:

auto lambda_QGate1( Op op , qclab::dense::SquareMatrix< T > mat1 ,
                      T* vector ) {
    assert( mat1.size() == 2 ) ;
    // operation
    qclab::dense::operateInPlace( op , mat1 ) ;
    const T m11 = mat1( 0 , 0 ) ; const T m12 = mat1( 0 , 1 ) ;
    const T m21 = mat1( 1 , 0 ) ; const T m22 = mat1( 1 , 1 ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ) {
      const T x1 = vector[a] ;
      const T x2 = vector[b] ;
      vector[a] = m11 * x1 + m12 * x2 ;
      vector[b] = m21 * x1 + m22 * x2 ;
    } ;
    return f ;
  }